

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O1

int nn_xrep_add(nn_sockbase *self,nn_pipe *pipe)

{
  int extraout_EAX;
  undefined8 *data;
  void *ptr;
  nn_pipe *self_00;
  nn_pipe *pnVar1;
  int rcvprio;
  size_t sz;
  int local_34;
  size_t local_30;
  
  local_30 = 4;
  self_00 = (nn_pipe *)0x0;
  pnVar1 = pipe;
  nn_pipe_getopt(pipe,0,9,&local_34,&local_30);
  if (local_30 == 4) {
    if (0xffffffef < local_34 - 0x11U) {
      pnVar1 = (nn_pipe *)0x48;
      data = (undefined8 *)nn_alloc_(0x48);
      if (data != (undefined8 *)0x0) {
        *data = pipe;
        nn_hash_item_init((nn_hash_item *)(data + 1));
        *(undefined4 *)(data + 8) = 0;
        nn_mutex_lock((nn_mutex *)(self + 0x1b));
        nn_hash_insert((nn_hash *)&self[1].sock,*(uint *)&self[1].vfptr & 0x7fffffff,
                       (nn_hash_item *)(data + 1));
        *(int *)&self[1].vfptr = *(int *)&self[1].vfptr + 1;
        nn_fq_add((nn_fq *)&self[2].sock,(nn_fq_data *)(data + 4),pipe,local_34);
        nn_pipe_setdata(pipe,data);
        nn_mutex_unlock((nn_mutex *)(self + 0x1b));
        return 0;
      }
      goto LAB_001273b4;
    }
  }
  else {
    nn_xrep_add_cold_1();
  }
  nn_xrep_add_cold_3();
LAB_001273b4:
  nn_xrep_add_cold_2();
  ptr = nn_pipe_getdata(self_00);
  nn_mutex_lock((nn_mutex *)(pnVar1 + 0x1b0));
  nn_fq_rm((nn_fq *)(pnVar1 + 0x28),(nn_fq_data *)((long)ptr + 0x20));
  nn_hash_erase((nn_hash *)(pnVar1 + 0x18),(nn_hash_item *)((long)ptr + 8));
  nn_mutex_unlock((nn_mutex *)(pnVar1 + 0x1b0));
  nn_hash_item_term((nn_hash_item *)((long)ptr + 8));
  nn_free(ptr);
  return extraout_EAX;
}

Assistant:

int nn_xrep_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xrep *xrep;
    struct nn_xrep_data *data;
    int rcvprio;
    size_t sz;

    xrep = nn_cont (self, struct nn_xrep, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xrep_data), "pipe data (xrep)");
    alloc_assert (data);
    data->pipe = pipe;
    nn_hash_item_init (&data->outitem);
    data->flags = 0;
    nn_mutex_lock(&xrep->sync);
    nn_hash_insert (&xrep->outpipes, xrep->next_key & 0x7fffffff,
        &data->outitem);
    ++xrep->next_key;
    nn_fq_add (&xrep->inpipes, &data->initem, pipe, rcvprio);
    nn_pipe_setdata (pipe, data);
    nn_mutex_unlock(&xrep->sync);

    return 0;
}